

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lincost.cc
# Opt level: O1

void __thiscall bsplib::LinCost::reset(LinCost *this,int nprocs)

{
  pointer puVar1;
  iterator __position;
  unsigned_long local_28;
  
  this->m_nprocs = nprocs;
  puVar1 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->m_sizes,(long)(nprocs + 1));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->m_counts,(long)(nprocs + 1));
  local_28 = 0;
  __position._M_current =
       (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->m_sizes,__position,&local_28);
  }
  else {
    *__position._M_current = 0;
    (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void LinCost::reset(int nprocs)
{
    m_nprocs = nprocs;
    m_sizes.clear(); m_counts.clear();
    m_sizes.reserve( nprocs + 1);
    m_counts.reserve( nprocs + 1);
    m_sizes.push_back(0); // we insert 0 as an extra option
}